

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qunicodetools.cpp
# Opt level: O3

void QUnicodeTools::Tailored::tibetanAttributes
               (Script script,char16_t *text,qsizetype from,qsizetype len,
               QCharAttributes *attributes)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  
  if (0 < len) {
    lVar3 = 0;
    do {
      lVar5 = 1;
      lVar4 = lVar5;
      if ((((ushort)(text[from + lVar3] + L'\xf0c0') < 0x80) &&
          (((ushort)text[from + lVar3] - 0xf40 & 0xfffffffc) < 0x2c)) &&
         (lVar6 = len - lVar3, 1 < lVar6)) {
        uVar1 = 1;
        do {
          lVar4 = lVar5;
          if (0x7f < (ushort)(text[from + lVar3 + lVar5] + L'\xf0c0')) break;
          uVar7 = (uint)(byte)tibetanForm[(ushort)text[from + lVar3 + lVar5] - 0xf40];
          if ((byte)tibetanForm[(ushort)text[from + lVar3 + lVar5] - 0xf40] - 2 < 2) {
            uVar2 = uVar1 - 3;
            uVar1 = uVar7;
            if (uVar2 < 0xfffffffe) break;
          }
          else if (uVar7 == 4) {
            if (uVar1 - 4 < 0xfffffffd) break;
          }
          else if (uVar7 < 2) break;
          lVar5 = lVar5 + 1;
          lVar4 = lVar6;
        } while (lVar6 != lVar5);
      }
      attributes[lVar3 + from] = (QCharAttributes)((byte)attributes[lVar3 + from] | 1);
      lVar5 = lVar4 + lVar3;
      if (len <= lVar4 + lVar3) {
        lVar5 = len;
      }
      lVar4 = lVar3 + 1;
      lVar3 = lVar4;
      if (lVar4 < lVar5) {
        do {
          attributes[lVar4 + from] = (QCharAttributes)((byte)attributes[lVar4 + from] & 0xfe);
          lVar4 = lVar4 + 1;
          lVar3 = lVar5;
        } while (lVar5 != lVar4);
      }
    } while (lVar3 < len);
  }
  return;
}

Assistant:

static void tibetanAttributes(QChar::Script script, const char16_t *text, qsizetype from, qsizetype len, QCharAttributes *attributes)
{
    qsizetype end = from + len;
    qsizetype i = 0;
    Q_UNUSED(script);
    attributes += from;
    while (i < len) {
        bool invalid;
        qsizetype boundary = tibetan_nextSyllableBoundary(text, from+i, end, &invalid) - from;

        attributes[i].graphemeBoundary = true;

        if (boundary > len-1) boundary = len;
        i++;
        while (i < boundary) {
            attributes[i].graphemeBoundary = false;
            ++i;
        }
        assert(i == boundary);
    }
}